

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O0

void __thiscall cornerstone::peer::send_req(peer *this,ptr<req_msg> *req,rpc_handler *handler)

{
  element_type *peVar1;
  element_type *in_RSI;
  anon_class_40_3_f550f714 *in_RDI;
  rpc_handler h;
  ptr<rpc_result> pending;
  function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&)>
  *in_stack_ffffffffffffff68;
  anon_class_40_3_f550f714 *__f;
  function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&)>
  *in_stack_ffffffffffffff80;
  undefined1 local_48 [32];
  anon_class_40_3_f550f714 local_28;
  
  __f = &local_28;
  local_28.pending.
  super___shared_ptr<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RSI;
  cs_new<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,std::shared_ptr<cornerstone::rpc_exception>>,std::function<void(std::shared_ptr<cornerstone::resp_msg>&,std::shared_ptr<cornerstone::rpc_exception>const&)>&>
            (in_stack_ffffffffffffff68);
  std::shared_ptr<cornerstone::req_msg>::shared_ptr
            ((shared_ptr<cornerstone::req_msg> *)in_RDI,
             (shared_ptr<cornerstone::req_msg> *)in_stack_ffffffffffffff68);
  std::
  shared_ptr<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>_>
  ::shared_ptr((shared_ptr<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>_>
                *)in_RDI,
               (shared_ptr<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>_>
                *)in_stack_ffffffffffffff68);
  std::
  function<void(std::shared_ptr<cornerstone::resp_msg>&,std::shared_ptr<cornerstone::rpc_exception>const&)>
  ::
  function<cornerstone::peer::send_req(std::shared_ptr<cornerstone::req_msg>&,std::function<void(std::shared_ptr<cornerstone::resp_msg>&,std::shared_ptr<cornerstone::rpc_exception>const&)>&)::__0,void>
            (in_stack_ffffffffffffff80,__f);
  send_req(std::shared_ptr<cornerstone::req_msg>&,std::function<void(std::shared_ptr<cornerstone::resp_msg>&,std::shared_ptr<cornerstone::rpc_exception>const&)>&)
  ::$_0::~__0(in_RDI);
  peVar1 = std::
           __shared_ptr_access<cornerstone::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1e6457);
  (*peVar1->_vptr_rpc_client[2])
            (peVar1,local_28.pending.
                    super___shared_ptr<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,local_48);
  std::
  function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&)>
  ::~function((function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&)>
               *)0x1e647c);
  std::
  shared_ptr<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>_>
  ::~shared_ptr((shared_ptr<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>_>
                 *)0x1e6486);
  return;
}

Assistant:

void peer::send_req(ptr<req_msg>& req, rpc_handler& handler)
{
    ptr<rpc_result> pending = cs_new<rpc_result>(handler);
    rpc_handler h = [this, req, pending](ptr<resp_msg>& resp, const ptr<rpc_exception>& ex) mutable
    { this->handle_rpc_result(req, pending, resp, ex); };
    rpc_->send(req, h);
}